

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O0

CProfileNode * __thiscall CProfileNode::Get_Sub_Node(CProfileNode *this,char *name)

{
  CProfileNode *name_00;
  char *in_RSI;
  CProfileNode *in_RDI;
  CProfileNode *node;
  CProfileNode *child;
  CProfileNode *local_20;
  
  local_20 = in_RDI->Child;
  while( true ) {
    if (local_20 == (CProfileNode *)0x0) {
      name_00 = (CProfileNode *)::operator_new(0x40);
      CProfileNode(in_RDI,(char *)name_00,(CProfileNode *)0x1567a7);
      name_00->Sibling = in_RDI->Child;
      in_RDI->Child = name_00;
      return name_00;
    }
    if (local_20->Name == in_RSI) break;
    local_20 = local_20->Sibling;
  }
  return local_20;
}

Assistant:

CProfileNode * CProfileNode::Get_Sub_Node( const char * name )
{
	// Try to find this sub node
	CProfileNode * child = Child;
	while ( child ) {
		if ( child->Name == name ) {
			return child;
		}
		child = child->Sibling;
	}

	// We didn't find it, so add it

	CProfileNode * node = new CProfileNode( name, this );
	node->Sibling = Child;
	Child = node;
	return node;
}